

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vmdict.cpp
# Opt level: O1

uint __thiscall
CVmHashFuncComparator::compute_hash(CVmHashFuncComparator *this,char *str,size_t len)

{
  vm_val_t *pvVar1;
  vm_obj_id_t vVar2;
  vm_val_t cobj_val;
  vm_rcdesc rc;
  vm_val_t local_80;
  vm_rcdesc local_70;
  
  vm_rcdesc::init_ret(&local_70,"HashComparator.calcHash");
  pvVar1 = sp_;
  sp_ = sp_ + 1;
  vVar2 = CVmObjString::create(0,str,len);
  pvVar1->typ = VM_OBJ;
  (pvVar1->val).obj = vVar2;
  local_80.val.obj = this->comparator_;
  local_80.typ = VM_OBJ;
  CVmRun::get_prop(&G_interpreter_X,0,&local_80,G_predef_X.calc_hash_prop,&local_80,1,&local_70);
  if (r0_.typ == VM_INT) {
    return r0_.val.obj;
  }
  err_throw(0x900);
}

Assistant:

unsigned int compute_hash(const char *str, size_t len) const
    {
        vm_val_t val;
        vm_val_t cobj_val;
        VMGLOB_PTR(globals_);

        /* set up a recursive call context */
        vm_rcdesc rc;
        rc.init_ret(vmg_ "HashComparator.calcHash");

        /* create a string object to represent the argument, and push it */
        G_stk->push()->set_obj(CVmObjString::create(vmg_ FALSE, str, len));

        /* invoke the calcHash method */
        cobj_val.set_obj(comparator_);
        G_interpreter->get_prop(vmg_ 0, &cobj_val, G_predef->calc_hash_prop,
                                &cobj_val, 1, &rc);

        /* retrieve the result from R0 */
        val = *G_interpreter->get_r0();

        /* we need an integer value from the method */
        if (val.typ == VM_INT)
        {
            /* return the hash value from the comparator */
            return val.val.intval;
        }
        else
        {
            /* no or invalid hash value - throw an error */
            err_throw(VMERR_BAD_TYPE_BIF);
            AFTER_ERR_THROW(return FALSE;)
        }
    }